

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teaminfo.cpp
# Opt level: O2

void __thiscall FTeam::ParseTeamInfo(FTeam *this)

{
  bool bVar1;
  int lumpnum;
  FScanner *this_00;
  int iLastLump;
  FScanner Scan;
  
  iLastLump = 0;
  TArray<FTeam,_FTeam>::Clear(&Teams);
  while( true ) {
    lumpnum = FWadCollection::FindLump(&Wads,"TEAMINFO",&iLastLump,false);
    if (lumpnum == -1) break;
    FScanner::FScanner(&Scan,lumpnum);
    while( true ) {
      bVar1 = FScanner::GetString(&Scan);
      if (!bVar1) break;
      bVar1 = FScanner::Compare(&Scan,"ClearTeams");
      if (bVar1) {
        TArray<FTeam,_FTeam>::Clear(&Teams);
      }
      else {
        this_00 = &Scan;
        bVar1 = FScanner::Compare(&Scan,"Team");
        if (bVar1) {
          ParseTeamDefinition((FTeam *)this_00,&Scan);
        }
        else {
          FScanner::ScriptError(&Scan,"ParseTeamInfo: Unknown team command \'%s\'.\n",Scan.String);
        }
      }
    }
    FScanner::~FScanner(&Scan);
  }
  if (Teams.Count < 2) {
    I_FatalError("ParseTeamInfo: At least two teams must be defined in TEAMINFO.");
  }
  else if (0x10 < Teams.Count) {
    I_FatalError("ParseTeamInfo: Too many teams defined. (Maximum: %d)",0x10);
  }
  return;
}

Assistant:

void FTeam::ParseTeamInfo ()
{
	int iLump, iLastLump = 0;

	Teams.Clear();
	while ((iLump = Wads.FindLump ("TEAMINFO", &iLastLump)) != -1)
	{
		FScanner Scan (iLump);

		while (Scan.GetString ())
		{
			if (Scan.Compare ("ClearTeams"))
				ClearTeams ();
			else if (Scan.Compare ("Team"))
				ParseTeamDefinition (Scan);
			else
				Scan.ScriptError ("ParseTeamInfo: Unknown team command '%s'.\n", Scan.String);
		}
	}

	if (Teams.Size () < 2)
		I_FatalError ("ParseTeamInfo: At least two teams must be defined in TEAMINFO.");
	else if (Teams.Size () > (unsigned)TEAM_MAXIMUM)
		I_FatalError ("ParseTeamInfo: Too many teams defined. (Maximum: %d)", TEAM_MAXIMUM);
}